

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGGeometryElement::layoutElement(SVGGeometryElement *this,SVGLayoutState *state)

{
  pointer pSVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  SVGPaintServer SVar2;
  StrokeData SStack_48;
  
  this->m_fill_rule = state->m_fill_rule;
  this->m_clip_rule = state->m_clip_rule;
  SVar2 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_fill,state->m_fill_opacity);
  this->m_fill = SVar2;
  SVar2 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_stroke,state->m_stroke_opacity);
  this->m_stroke = SVar2;
  SVGGraphicsElement::getStrokeData(&SStack_48,&this->super_SVGGraphicsElement,state);
  StrokeData::operator=(&this->m_strokeData,&SStack_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&SStack_48.m_dashArray.super__Vector_base<float,_std::allocator<float>_>);
  SVGElement::layoutElement((SVGElement *)this,state);
  Path::reset(&this->m_path);
  pSVar1 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_markerPositions).
      super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (this->m_markerPositions).
    super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0x12])
            (this,&this->m_path);
  (this->m_fillBoundingBox).x = extraout_XMM0_Da;
  (this->m_fillBoundingBox).y = extraout_XMM0_Db;
  (this->m_fillBoundingBox).w = (float)in_XMM1_Qa;
  (this->m_fillBoundingBox).h = (float)((ulong)in_XMM1_Qa >> 0x20);
  updateMarkerPositions(this,&this->m_markerPositions,state);
  return;
}

Assistant:

void SVGGeometryElement::layoutElement(const SVGLayoutState& state)
{
    m_fill_rule = state.fill_rule();
    m_clip_rule = state.clip_rule();
    m_fill = getPaintServer(state.fill(), state.fill_opacity());
    m_stroke = getPaintServer(state.stroke(), state.stroke_opacity());
    m_strokeData = getStrokeData(state);
    SVGGraphicsElement::layoutElement(state);

    m_path.reset();
    m_markerPositions.clear();
    m_fillBoundingBox = updateShape(m_path);
    updateMarkerPositions(m_markerPositions, state);
}